

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntWeakPtr<Diligent::IRenderDevice> * __thiscall
Diligent::RefCntWeakPtr<Diligent::IRenderDevice>::operator=
          (RefCntWeakPtr<Diligent::IRenderDevice> *this,IRenderDevice *pObj)

{
  RefCntWeakPtr<Diligent::IRenderDevice> *pRVar1;
  RefCntWeakPtr<Diligent::IRenderDevice> local_28;
  IRenderDevice *local_18;
  IRenderDevice *pObj_local;
  RefCntWeakPtr<Diligent::IRenderDevice> *this_local;
  
  local_18 = pObj;
  pObj_local = (IRenderDevice *)this;
  RefCntWeakPtr(&local_28,pObj);
  pRVar1 = operator=(this,&local_28);
  ~RefCntWeakPtr(&local_28);
  return pRVar1;
}

Assistant:

RefCntWeakPtr& operator=(T* pObj) noexcept
    {
        return operator=(RefCntWeakPtr(pObj));
    }